

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpack-to-json.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  _Alloc_hider slice;
  size_type sVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  undefined4 extraout_var;
  size_t sVar9;
  ostream *poVar10;
  int iVar11;
  char *pcVar12;
  char *pcVar13;
  bool bVar14;
  size_type sVar15;
  int iVar16;
  char *pcVar17;
  string s;
  string infile;
  Dumper dumper;
  CharBufferSink sink;
  Buffer<char> buffer;
  ifstream ifs;
  ofstream ofs;
  int local_83d0;
  int local_83c8;
  char *local_83c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_83b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8398;
  ulong local_8378;
  Options local_8370;
  Dumper local_8340;
  Sink local_8328;
  Buffer<char> *local_8320;
  Buffer<char> local_8318;
  long local_8240;
  size_type local_8238;
  int aiStack_8220 [122];
  undefined1 local_8038 [8];
  size_type local_8030;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8028 [14];
  ios_base local_7f40 [32528];
  
  local_8378 = 0;
  iVar16 = 1;
  local_83c8 = 1;
  bVar6 = true;
  bVar5 = true;
  bVar14 = true;
  local_83c0 = (char *)0x0;
  pcVar12 = (char *)0x0;
  local_83d0 = 0;
  while (iVar16 < argc) {
    pcVar17 = argv[iVar16];
    pcVar13 = pcVar12;
    pcVar4 = local_83c0;
    if (bVar14) {
      iVar8 = strcmp(pcVar17,"--help");
      if (iVar8 != 0) {
        iVar8 = strcmp(pcVar17,"--pretty");
        if (iVar8 == 0) {
          bVar5 = true;
        }
        else {
          iVar8 = strcmp(pcVar17,"--no-pretty");
          if (iVar8 == 0) {
            bVar5 = false;
          }
          else {
            iVar8 = strcmp(pcVar17,"--print-unsupported");
            if (iVar8 == 0) {
              local_83c8 = 1;
            }
            else {
              iVar8 = strcmp(pcVar17,"--no-print-unsupported");
              if (iVar8 == 0) {
                local_83c8 = 0;
              }
              else {
                iVar8 = strcmp(pcVar17,"--hex");
                if (iVar8 == 0) {
                  local_8378 = CONCAT71((int7)(CONCAT44(extraout_var,iVar8) >> 8),1);
                }
                else {
                  iVar8 = strcmp(pcVar17,"--validate");
                  if (iVar8 == 0) {
                    bVar6 = true;
                  }
                  else {
                    iVar8 = strcmp(pcVar17,"--no-validate");
                    if (iVar8 == 0) {
                      bVar6 = false;
                    }
                    else {
                      iVar8 = strcmp(pcVar17,"--");
                      if (iVar8 != 0) goto LAB_00103da2;
                      bVar14 = false;
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_00103e27;
      }
      bVar2 = false;
      usage(argv);
      local_83d0 = 0;
    }
    else {
LAB_00103da2:
      pcVar13 = pcVar17;
      if ((pcVar12 == (char *)0x0) ||
         (pcVar13 = pcVar12, pcVar4 = pcVar17, local_83c0 == (char *)0x0)) {
LAB_00103e27:
        local_83c0 = pcVar4;
        iVar16 = iVar16 + 1;
        bVar2 = true;
        pcVar12 = pcVar13;
      }
      else {
        usage(argv);
        local_83d0 = 1;
        bVar2 = false;
      }
    }
    if (!bVar2) {
      return local_83d0;
    }
  }
  pcVar17 = "-";
  if (pcVar12 != (char *)0x0) {
    pcVar17 = pcVar12;
  }
  if ((local_83c0 == (char *)0x0) || (iVar16 = strcmp(local_83c0,"+"), iVar16 == 0)) {
    local_83c0 = "/proc/self/fd/1";
    bVar14 = true;
  }
  else {
    bVar14 = false;
  }
  local_8398._M_dataplus._M_p = (pointer)&local_8398.field_2;
  sVar9 = strlen(pcVar17);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8398,pcVar17,pcVar17 + sVar9);
  iVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     (&local_8398,"-");
  if (iVar16 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_8398,0,local_8398._M_string_length,"/proc/self/fd/0",0xf);
  }
  local_83b8._M_dataplus._M_p = (pointer)&local_83b8.field_2;
  local_83b8._M_string_length = 0;
  local_83b8.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&local_8240,(string *)&local_8398,_S_in);
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot read infile \'",0x14);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_8398._M_dataplus._M_p,
                         local_8398._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    local_83d0 = 1;
    std::ostream::flush();
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&local_83b8,0x8000);
    while (*(int *)((long)aiStack_8220 + *(long *)(local_8240 + -0x18)) == 0) {
      std::istream::read((char *)&local_8240,(long)local_8038);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_83b8,local_8038,local_8238);
    }
    std::ifstream::close();
    if ((local_8378 & 1) != 0) {
      local_8030 = 0;
      local_8028[0]._M_local_buf[0] = '\0';
      local_8038 = (undefined1  [8])local_8028;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8038,
                 local_83b8._M_string_length);
      sVar3 = local_83b8._M_string_length;
      if (local_83b8._M_string_length != 0) {
        sVar15 = 0;
        iVar16 = -1;
        do {
          bVar1 = local_83b8._M_dataplus._M_p[sVar15];
          iVar8 = -0x30;
          if (((byte)(bVar1 - 0x30) < 10) || (iVar8 = -0x57, (byte)(bVar1 + 0x9f) < 6)) {
LAB_0010441b:
            iVar11 = iVar8 + (uint)bVar1;
            if (iVar16 != -1) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_8038,(char)iVar11 + (char)(iVar16 << 4));
              iVar11 = -1;
            }
          }
          else {
            iVar11 = -1;
            iVar8 = -0x37;
            if ((byte)(bVar1 + 0xbf) < 6) goto LAB_0010441b;
          }
          sVar15 = sVar15 + 1;
          iVar16 = iVar11;
        } while (sVar3 != sVar15);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_83b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8038);
      if (local_8038 != (undefined1  [8])local_8028) {
        operator_delete((void *)local_8038,
                        CONCAT71(local_8028[0]._M_allocated_capacity._1_7_,
                                 local_8028[0]._M_local_buf[0]) + 1);
      }
    }
    local_8370.paddingBehavior = Flexible;
    local_8370.buildUnindexedArrays = false;
    local_8370.buildUnindexedObjects = false;
    local_8370.singleLinePrettyPrint = false;
    local_8370.keepTopLevelOpen = false;
    local_8370.attributeTranslator = (AttributeTranslator *)0x0;
    local_8370.customTypeHandler._0_5_ = 0;
    local_8370.customTypeHandler._5_3_ = 0;
    local_8370.escapeControl = true;
    local_8370.escapeUnicode = false;
    local_8370.dumpAttributesInIndexOrder = true;
    local_8370.unsupportedDoublesAsString = false;
    local_8370.binaryAsHex = false;
    local_8370.datesAsIntegers = false;
    local_8370.disallowExternals = false;
    local_8370.disallowCustom = false;
    local_8370.disallowTags = false;
    local_8370.disallowBCD = false;
    local_8370.debugTags = false;
    local_8370.nestingLimit = 0xffffffff;
    local_8370.clearBuilderBeforeParse = true;
    local_8370.validateUtf8Strings = true;
    local_8370.checkAttributeUniqueness = true;
    local_8370.escapeForwardSlashes = false;
    local_8370.unsupportedTypeBehavior = FailOnUnsupportedType - local_83c8;
    local_8370.prettyPrint = bVar5;
    if (bVar6) {
      arangodb::velocypack::Validator::Validator((Validator *)local_8038,&local_8370);
      arangodb::velocypack::Validator::validate
                ((Validator *)local_8038,(uint8_t *)local_83b8._M_dataplus._M_p,
                 local_83b8._M_string_length,false);
    }
    slice._M_p = local_83b8._M_dataplus._M_p;
    arangodb::velocypack::Buffer<char>::Buffer(&local_8318,0x1000);
    local_8328._vptr_Sink = (_func_int **)&PTR__Sink_00119c40;
    local_8320 = &local_8318;
    arangodb::velocypack::Dumper::Dumper(&local_8340,&local_8328,&local_8370);
    arangodb::velocypack::Dumper::dump(&local_8340,(Slice)slice._M_p);
    std::ofstream::ofstream(local_8038,local_83c0,_S_out);
    cVar7 = std::__basic_file<char>::is_open();
    if (cVar7 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot write outfile \'",0x16);
      sVar9 = strlen(local_83c0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_83c0,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
      std::ostream::put('\0');
      local_83d0 = 1;
      std::ostream::flush();
    }
    else {
      if (!bVar14) {
        std::ostream::seekp(local_8038,0,0);
      }
      std::ostream::write(local_8038,(long)local_8318._buffer);
      std::ofstream::close();
      if (!bVar14) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Successfully converted JSON infile \'",0x24);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_8398._M_dataplus._M_p,
                             local_8398._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"VPack Infile size: ",0x13);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"JSON Outfile size: ",0x13);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
    }
    local_8038 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_8038 + *(long *)(_VTT->_M_local_buf + -0x18)) = __filebuf;
    std::filebuf::~filebuf((filebuf *)&local_8030);
    std::ios_base::~ios_base(local_7f40);
    if (local_8318._buffer != local_8318._local) {
      free(local_8318._buffer);
    }
  }
  std::ifstream::~ifstream(&local_8240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_83b8._M_dataplus._M_p != &local_83b8.field_2) {
    operator_delete(local_83b8._M_dataplus._M_p,
                    CONCAT71(local_83b8.field_2._M_allocated_capacity._1_7_,
                             local_83b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8398._M_dataplus._M_p != &local_8398.field_2) {
    operator_delete(local_8398._M_dataplus._M_p,local_8398.field_2._M_allocated_capacity + 1);
  }
  return local_83d0;
}

Assistant:

int main(int argc, char* argv[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  char const* infileName = nullptr;
  char const* outfileName = nullptr;
  bool allowFlags = true;
  bool pretty = true;
  bool printUnsupported = true;
  bool hex = false;
  bool validate = true;

  int i = 1;
  while (i < argc) {
    char const* p = argv[i];
    if (allowFlags && isOption(p, "--help")) {
      usage(argv);
      return EXIT_SUCCESS;
    } else if (allowFlags && isOption(p, "--pretty")) {
      pretty = true;
    } else if (allowFlags && isOption(p, "--no-pretty")) {
      pretty = false;
    } else if (allowFlags && isOption(p, "--print-unsupported")) {
      printUnsupported = true;
    } else if (allowFlags && isOption(p, "--no-print-unsupported")) {
      printUnsupported = false;
    } else if (allowFlags && isOption(p, "--hex")) {
      hex = true;
    } else if (allowFlags && isOption(p, "--validate")) {
      validate = true;
    } else if (allowFlags && isOption(p, "--no-validate")) {
      validate = false;
    } else if (allowFlags && isOption(p, "--")) {
      allowFlags = false;
    } else if (infileName == nullptr) {
      infileName = p;
    } else if (outfileName == nullptr) {
      outfileName = p;
    } else {
      usage(argv);
      return EXIT_FAILURE;
    }
    ++i;
  }

#ifdef __linux__
  if (infileName == nullptr) {
    infileName = "-";
  }
#endif

  if (infileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }

#ifdef __linux__
  // treat missing outfile as stdout
  bool toStdOut = false;
  if (outfileName == nullptr || strcmp(outfileName, "+") == 0) {
    outfileName = "/proc/self/fd/1";
    toStdOut = true;
  }
#else
  bool const toStdOut = false;
  if (outfileName == nullptr) {
    usage(argv);
    return EXIT_FAILURE;
  }
#endif

  // treat "-" as stdin
  std::string infile = infileName;
#ifdef __linux__
  if (infile == "-") {
    infile = "/proc/self/fd/0";
  }
#endif

  std::string s;
  std::ifstream ifs(infile, std::ifstream::in);

  if (!ifs.is_open()) {
    std::cerr << "Cannot read infile '" << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  {
    char buffer[32768];
    s.reserve(sizeof(buffer));

    while (ifs.good()) {
      ifs.read(&buffer[0], sizeof(buffer));
      s.append(buffer, checkOverflow(ifs.gcount()));
    }
  }
  ifs.close();

  if (hex) {
    s = convertFromHex(s);
  }

  Options options;
  options.prettyPrint = pretty;
  options.checkAttributeUniqueness = true;
  options.validateUtf8Strings = true;
  options.unsupportedTypeBehavior =
      (printUnsupported ? Options::ConvertUnsupportedType
                        : Options::FailOnUnsupportedType);

  if (validate) {
    Validator validator(&options);
    validator.validate(reinterpret_cast<uint8_t const*>(s.data()), s.size(),
                       false);
  }

  Slice const slice(reinterpret_cast<uint8_t const*>(s.data()));

  Buffer<char> buffer(4096);
  CharBufferSink sink(&buffer);
  Dumper dumper(&sink, &options);

  try {
    dumper.dump(slice);
  } catch (Exception const& ex) {
    std::cerr << "An exception occurred while processing infile '" << infile
              << "': " << ex.what() << std::endl;
    return EXIT_FAILURE;
  } catch (...) {
    std::cerr << "An unknown exception occurred while processing infile '"
              << infile << "'" << std::endl;
    return EXIT_FAILURE;
  }

  std::ofstream ofs(outfileName, std::ofstream::out);

  if (!ofs.is_open()) {
    std::cerr << "Cannot write outfile '" << outfileName << "'" << std::endl;
    return EXIT_FAILURE;
  }

  // reset stream
  if (!toStdOut) {
    ofs.seekp(0);
  }

  // write into stream
  char const* start = buffer.data();
  ofs.write(start, buffer.size());

  ofs.close();

  if (!toStdOut) {
    std::cout << "Successfully converted JSON infile '" << infile << "'"
              << std::endl;
    std::cout << "VPack Infile size: " << s.size() << std::endl;
    std::cout << "JSON Outfile size: " << buffer.size() << std::endl;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}